

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask15_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xf | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[1] = uVar1;
  uVar1 = in[3] << 0xd | uVar1;
  out[1] = uVar1;
  uVar2 = in[4];
  out[1] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[2] = uVar2;
  uVar2 = in[5] << 0xb | uVar2;
  out[2] = uVar2;
  uVar1 = in[6];
  out[2] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[3] = uVar1;
  uVar1 = in[7] << 9 | uVar1;
  out[3] = uVar1;
  uVar2 = in[8];
  out[3] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[4] = uVar2;
  uVar2 = in[9] << 7 | uVar2;
  out[4] = uVar2;
  uVar1 = in[10];
  out[4] = uVar1 << 0x16 | uVar2;
  uVar1 = uVar1 >> 10;
  out[5] = uVar1;
  uVar1 = in[0xb] << 5 | uVar1;
  out[5] = uVar1;
  uVar2 = in[0xc];
  out[5] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[6] = uVar2;
  uVar2 = in[0xd] << 3 | uVar2;
  out[6] = uVar2;
  uVar1 = in[0xe];
  out[6] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[7] = uVar1;
  uVar1 = in[0xf] * 2 | uVar1;
  out[7] = uVar1;
  uVar1 = in[0x10] << 0x10 | uVar1;
  out[7] = uVar1;
  uVar2 = in[0x11];
  out[7] = uVar2 << 0x1f | uVar1;
  uVar2 = uVar2 >> 1;
  out[8] = uVar2;
  uVar2 = in[0x12] << 0xe | uVar2;
  out[8] = uVar2;
  uVar1 = in[0x13];
  out[8] = uVar1 << 0x1d | uVar2;
  uVar1 = uVar1 >> 3;
  out[9] = uVar1;
  uVar1 = in[0x14] << 0xc | uVar1;
  out[9] = uVar1;
  uVar2 = in[0x15];
  out[9] = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[10] = uVar2;
  uVar2 = in[0x16] << 10 | uVar2;
  out[10] = uVar2;
  uVar1 = in[0x17];
  out[10] = uVar1 << 0x19 | uVar2;
  uVar1 = uVar1 >> 7;
  out[0xb] = uVar1;
  uVar1 = in[0x18] << 8 | uVar1;
  out[0xb] = uVar1;
  uVar2 = in[0x19];
  out[0xb] = uVar2 << 0x17 | uVar1;
  uVar2 = uVar2 >> 9;
  out[0xc] = uVar2;
  uVar2 = in[0x1a] << 6 | uVar2;
  out[0xc] = uVar2;
  uVar1 = in[0x1b];
  out[0xc] = uVar1 << 0x15 | uVar2;
  uVar1 = uVar1 >> 0xb;
  out[0xd] = uVar1;
  uVar1 = in[0x1c] << 4 | uVar1;
  out[0xd] = uVar1;
  uVar2 = in[0x1d];
  out[0xd] = uVar2 << 0x13 | uVar1;
  uVar2 = uVar2 >> 0xd;
  out[0xe] = uVar2;
  uVar2 = in[0x1e] << 2 | uVar2;
  out[0xe] = uVar2;
  out[0xe] = in[0x1f] << 0x11 | uVar2;
  return out + 0xf;
}

Assistant:

uint32_t *__fastpackwithoutmask15_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (15 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (15 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (15 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (15 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (15 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (15 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (15 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (15 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (15 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (15 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (15 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (15 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (15 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (15 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  ++in;

  return out;
}